

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O0

void __thiscall
yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
          (NN *this,string_view name,TensorShape *params,TensorShape *params_1)

{
  DenseLayer *pDVar1;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DenseLayer *local_38;
  DenseLayer *new_layer;
  TensorShape *params_local_1;
  TensorShape *params_local;
  NN *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (NN *)name._M_len;
  new_layer = (DenseLayer *)params_1;
  params_local_1 = params;
  params_local = (TensorShape *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_59);
  pDVar1 = Factory<yyml::nn::DenseLayer>::
           GetNewInstance<yyml::TensorShape,yyml::TensorShape,std::__cxx11::string>
                     (params,params_1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_91);
  std::
  unordered_map<std::__cxx11::string,yyml::nn::LayerInterface*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>>
  ::emplace<std::__cxx11::string,yyml::nn::DenseLayer*&>
            ((unordered_map<std::__cxx11::string,yyml::nn::LayerInterface*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>>
              *)&this->layers_,&local_90,&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

void SetLayer(std::string_view name, Params... params) {
    auto* new_layer = LayerType::factory::GetNewInstance(
        std::forward<Params>(params)..., std::string(name));
    layers_.emplace(std::string(name), new_layer);
  }